

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O2

void __thiscall ocmesh::details::obj::cube(obj *this,voxel v)

{
  unsigned_long local_80;
  voxel v_local;
  array<glm::tvec3<float,_(glm::precision)0>,_8UL> c;
  
  v_local = v;
  voxel::corners<glm::tvec3<float,(glm::precision)0>>
            ((array<glm::tvec3<float,_(glm::precision)0>,_8UL> *)c._M_elems,&v_local);
  local_80 = ((long)(this->_vertices).
                    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_vertices).
                   super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->_indexes,&local_80);
  std::
  vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>::
  insert<glm::tvec3<float,(glm::precision)0>*,void>
            ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
              *)this,(this->_vertices).
                     super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,c._M_elems,
             (tvec3<float,_(glm::precision)0> *)&stack0xfffffffffffffff0);
  return;
}

Assistant:

void cube(voxel v) {
            auto c = v.corners<glm::vec3>();
            
            _indexes.push_back(_vertices.size());
            
            _vertices.insert(_vertices.end(), begin(c), end(c));
        }